

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::LogicalConstant)>::
PrintTriedExpectationsLocked
          (FunctionMockerBase<TestResult_(mp::LogicalConstant)> *this,ArgumentTuple *args,
          ostream *why)

{
  pointer plVar1;
  pointer plVar2;
  TypedExpectation<TestResult_(mp::LogicalConstant)> *this_00;
  ostream *poVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  plVar1 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  plVar2 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>(why,"Google Mock tried the following ",0x20);
  uVar7 = (uint)((ulong)((long)plVar1 - (long)plVar2) >> 4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)why,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pcVar5 = "expectations, but none matched";
  if (uVar7 == 1) {
    pcVar5 = "expectation, but it didn\'t match";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,(ulong)(uVar7 == 1) * 2 + 0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
  if (0 < (int)uVar7) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      this_00 = *(TypedExpectation<TestResult_(mp::LogicalConstant)> **)
                 ((long)&((this->super_UntypedFunctionMockerBase).untyped_expectations_.
                          super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->value_ + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(why,"\n",1);
      ExpectationBase::DescribeLocationTo(&this_00->super_ExpectationBase,why);
      if (uVar7 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>(why,"tried expectation #",0x13);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)why,(int)uVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      }
      pcVar5 = (this_00->super_ExpectationBase).source_text_._M_dataplus._M_p;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)why + (int)*(undefined8 *)(*(long *)why + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(why,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(why,"...\n",4);
      TypedExpectation<TestResult_(mp::LogicalConstant)>::ExplainMatchResultTo(this_00,args,why);
      ExpectationBase::DescribeCallCountTo(&this_00->super_ExpectationBase,why);
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x10;
    } while ((uVar7 & 0x7fffffff) != uVar6);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = static_cast<int>(untyped_expectations_.size());
    *why << "Google Mock tried the following " << count << " "
         << (count == 1 ? "expectation, but it didn't match" :
             "expectations, but none matched")
         << ":\n";
    for (int i = 0; i < count; i++) {
      TypedExpectation<F>* const expectation =
          static_cast<TypedExpectation<F>*>(untyped_expectations_[i].get());
      *why << "\n";
      expectation->DescribeLocationTo(why);
      if (count > 1) {
        *why << "tried expectation #" << i << ": ";
      }
      *why << expectation->source_text() << "...\n";
      expectation->ExplainMatchResultTo(args, why);
      expectation->DescribeCallCountTo(why);
    }
  }